

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowHitTestHole(ImGuiWindow *window,ImVec2 *pos,ImVec2 *size)

{
  ImVec2 local_30;
  ImVec2ih local_28;
  ImVec2ih local_24;
  ImVec2 *local_20;
  ImVec2 *size_local;
  ImVec2 *pos_local;
  ImGuiWindow *window_local;
  
  local_20 = size;
  size_local = pos;
  pos_local = (ImVec2 *)window;
  if ((window->HitTestHoleSize).x == 0) {
    ImVec2ih::ImVec2ih(&local_24,size);
    pos_local[0x4f].x = (float)local_24;
    local_30 = operator-(size_local,pos_local + 2);
    ImVec2ih::ImVec2ih(&local_28,&local_30);
    pos_local[0x4f].y = (float)local_28;
    return;
  }
  __assert_fail("window->HitTestHoleSize.x == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x19e5,
                "void ImGui::SetWindowHitTestHole(ImGuiWindow *, const ImVec2 &, const ImVec2 &)");
}

Assistant:

void ImGui::SetWindowHitTestHole(ImGuiWindow* window, const ImVec2& pos, const ImVec2& size)
{
    IM_ASSERT(window->HitTestHoleSize.x == 0);     // We don't support multiple holes/hit test filters
    window->HitTestHoleSize = ImVec2ih(size);
    window->HitTestHoleOffset = ImVec2ih(pos - window->Pos);
}